

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O2

int FsFindClose(HANDLE Hdl)

{
  pResources pRes;
  
  if (Hdl != (HANDLE)0x0) {
    if (*(void **)((long)Hdl + 8) != (void *)0x0) {
      operator_delete__(*(void **)((long)Hdl + 8));
    }
    operator_delete(Hdl,0x10);
  }
  return 0;
}

Assistant:

int DCPCALL FsFindClose(HANDLE Hdl){
    pResources pRes = (pResources) Hdl;
    if(pRes){
        if(pRes->resource_array)
            delete[] pRes->resource_array;

        delete pRes;
    }

    return 0;
}